

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p,uchar *tweak32)

{
  int iVar1;
  int overflow;
  secp256k1_scalar term;
  secp256k1_scalar local_b8;
  secp256k1_gej pt;
  
  overflow = 0;
  secp256k1_scalar_set_b32(&term,tweak32,&overflow);
  iVar1 = 0;
  if (overflow == 0) {
    pt.infinity = p->infinity;
    pt.x.n[0] = (p->x).n[0];
    pt.x.n[1] = (p->x).n[1];
    pt.x.n[2] = (p->x).n[2];
    pt.x.n[3] = (p->x).n[3];
    pt.x.n[4] = (p->x).n[4];
    pt.y.n[0] = (p->y).n[0];
    pt.y.n[1] = (p->y).n[1];
    pt.y.n[2] = (p->y).n[2];
    pt.y.n[3] = (p->y).n[3];
    pt.y.n[4] = (p->y).n[4];
    pt.z.n[0] = 1;
    pt.z.n[1] = 0;
    pt.z.n[2] = 0;
    pt.z.n[3] = 0;
    pt.z.n[4] = 0;
    local_b8.d[0] = 1;
    local_b8.d[1] = 0;
    local_b8.d[2] = 0;
    local_b8.d[3] = 0;
    secp256k1_ecmult(&pt,&pt,&local_b8,&term);
    iVar1 = 0;
    if (pt.infinity == 0) {
      secp256k1_ge_set_gej(p,&pt);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    return !overflow && secp256k1_eckey_pubkey_tweak_add(p, &term);
}